

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord.hh
# Opt level: O3

void avro::codec_traits<testgen::_bigrecord_Union__0__>::decode(Decoder *d,_bigrecord_Union__0__ *v)

{
  placeholder *tmp;
  ulong uVar1;
  placeholder *ppVar2;
  undefined8 *puVar3;
  placeholder *ppVar4;
  undefined4 uVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  vv;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_50;
  
  uVar1 = (**(code **)(*(long *)d + 0xb0))();
  if (2 < uVar1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x18);
    local_50._M_impl._0_8_ = &local_50._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Union index too big","");
    std::runtime_error::runtime_error((runtime_error *)(puVar3 + 1),(string *)&local_50);
    *puVar3 = 0x1c87a8;
    puVar3[1] = 0x1c87d8;
    __cxa_throw(puVar3,&Exception::typeinfo,Exception::~Exception);
  }
  if (uVar1 == 2) {
    uVar5 = (**(code **)(*(long *)d + 0x38))(d);
    v->idx_ = 2;
    ppVar2 = (placeholder *)operator_new(0x10);
    ppVar2->_vptr_placeholder = (_func_int **)&PTR__placeholder_001c8928;
    *(undefined4 *)&ppVar2[1]._vptr_placeholder = uVar5;
    ppVar4 = (v->value_).content;
    (v->value_).content = ppVar2;
  }
  else {
    if (uVar1 == 1) {
      local_50._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_50._M_impl.super__Rb_tree_header._M_header;
      local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_50._M_impl.super__Rb_tree_header._M_header._M_right =
           local_50._M_impl.super__Rb_tree_header._M_header._M_left;
      codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
      ::decode(d,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)&local_50);
      v->idx_ = 1;
      boost::any::operator=
                (&v->value_,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)&local_50);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&local_50);
      return;
    }
    (**(code **)(*(long *)d + 0x18))(d);
    ppVar4 = (v->value_).content;
    v->idx_ = 0;
    (v->value_).content = (placeholder *)0x0;
  }
  if (ppVar4 == (placeholder *)0x0) {
    return;
  }
  (*ppVar4->_vptr_placeholder[1])();
  return;
}

Assistant:

static void decode(Decoder& d, testgen::_bigrecord_Union__0__& v) {
        size_t n = d.decodeUnionIndex();
        if (n >= 3) { throw avro::Exception("Union index too big"); }
        switch (n) {
        case 0:
            d.decodeNull();
            v.set_null();
            break;
        case 1:
            {
                std::map<std::string, int32_t > vv;
                avro::decode(d, vv);
                v.set_map(vv);
            }
            break;
        case 2:
            {
                float vv;
                avro::decode(d, vv);
                v.set_float(vv);
            }
            break;
        }
    }